

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  cmExportSet *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  
  pcVar1 = this->ExportSet;
  if (pcVar1 != (cmExportSet *)0x0) {
    ppcVar2 = (pcVar1->TargetExports).
              super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar3 = (pcVar1->TargetExports).
                   super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar3 != ppcVar2; ppcVar3 = ppcVar3 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(targets,&(*ppcVar3)->TargetName);
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(targets,&this->Targets);
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<std::string>& targets) const
{
  if (this->ExportSet) {
    for (cmTargetExport* te : *this->ExportSet->GetTargetExports()) {
      targets.push_back(te->TargetName);
    }
    return;
  }
  targets = this->Targets;
}